

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::ExcludesError::ExcludesError(ExcludesError *this,string *msg,ExitCodes exit_code)

{
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"ExcludesError",&local_69);
  ::std::__cxx11::string::string
            (&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,(string *)&local_68,exit_code);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  (this->super_ParseError).super_Error.super_runtime_error.super_exception._vptr_exception =
       (_func_int **)&PTR__Error_0026cc48;
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}